

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureCubeMapArraySubImage3D::iterate(TextureCubeMapArraySubImage3D *this)

{
  GLuint width;
  uint height;
  GLuint depth;
  long lVar1;
  ulong uVar2;
  char *description;
  uint uVar3;
  GLboolean test_passed;
  GLboolean local_69;
  SubImage3DCopyParams local_68;
  uint local_44;
  ulong local_40;
  long local_38;
  
  initTest(this);
  local_69 = '\x01';
  uVar2 = 0;
  do {
    lVar1 = 8;
    local_40 = uVar2;
    do {
      width = *(GLuint *)((long)&m_n_resolutions + lVar1);
      height = *(uint *)((long)&m_n_storage_type + lVar1);
      depth = *(GLuint *)((long)&resolutions + lVar1);
      local_38 = lVar1;
      configureCubeMapArrayTexture(this,width,height,depth,(STORAGE_TYPE)local_40,0);
      local_68.m_xoffset = 0;
      local_68.m_yoffset = 0;
      local_68._8_8_ = (ulong)width << 0x20;
      local_68.m_depth = 1;
      local_68.m_height = height;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      configure2DTexture(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      testCopyTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      uVar3 = width >> 1;
      local_44 = height >> 1;
      local_68.m_yoffset = local_44;
      local_68.m_xoffset = uVar3;
      local_68._8_8_ = (ulong)uVar3 << 0x20;
      local_68.m_depth = 1;
      local_68.m_height = local_44;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      configure2DTexture(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      testCopyTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      delete2DTexture(this);
      local_68.m_xoffset = 0;
      local_68.m_yoffset = 0;
      local_68._8_8_ = (ulong)width << 0x20;
      local_68.m_depth = 6;
      local_68.m_height = height;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      local_68.m_xoffset = 0;
      local_68.m_yoffset = 0;
      local_68.m_width = width;
      local_68.m_zoffset = 3;
      local_68.m_depth = 6;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      local_68.m_yoffset = local_44;
      local_68.m_xoffset = uVar3;
      local_68._8_8_ = (ulong)uVar3 << 0x20;
      local_68.m_depth = 6;
      local_68.m_height = local_44;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      local_68.m_yoffset = local_44;
      local_68.m_width = uVar3;
      local_68.m_zoffset = 3;
      local_68.m_depth = 6;
      local_68.m_height = local_44;
      configureDataBuffer(this,width,height,depth,&local_68,0);
      configurePixelUnpackBuffer(this,&local_68);
      testTexSubImage3D(this,width,height,depth,&local_68,&local_69);
      deletePixelUnpackBuffer(this);
      deleteCubeMapArrayTexture(this);
      lVar1 = local_38 + 0xc;
    } while (lVar1 != 0x38);
    uVar2 = (ulong)((int)local_40 + 1);
  } while ((int)local_40 == 0);
  if (local_69 == '\0') {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(local_69 == '\0'),description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArraySubImage3D::iterate()
{
	initTest();

	glw::GLboolean test_passed = true;

	/* Execute test throught all storage types */
	for (glw::GLuint storage_index = 0; storage_index < m_n_storage_type; ++storage_index)
	{
		/* Execute test throught all texture resolutions */
		for (glw::GLuint resolution_index = 0; resolution_index < m_n_resolutions; ++resolution_index)
		{
			glw::GLuint width  = resolutions[resolution_index][DL_WIDTH];
			glw::GLuint height = resolutions[resolution_index][DL_HEIGHT];
			glw::GLuint depth  = resolutions[resolution_index][DL_DEPTH];

			configureCubeMapArrayTexture(width, height, depth, static_cast<STORAGE_TYPE>(storage_index), 0);

			/* A single whole layer-face at index 0 should be replaced (both functions) */
			SubImage3DCopyParams copy_params;
			copy_params.init(0, 0, 0, width, height, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* A region of a layer-face at index 0 should be replaced (both functions) */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 1);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			configure2DTexture(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			testCopyTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();
			delete2DTexture();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 0, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only) */
			copy_params.init(0, 0, 3, width, height, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up a single layer, should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 0, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			/* 6 layer-faces, making up two different layers (for instance: three last layer-faces of
			 layer 1 and three first layer-faces of layer 2) should be replaced (glTexSubImage3D() only),
			 but limited to a quad */
			copy_params.init(width / 2, height / 2, 3, width / 2, height / 2, 6);

			configureDataBuffer(width, height, depth, copy_params, 0);
			configurePixelUnpackBuffer(copy_params);
			testTexSubImage3D(width, height, depth, copy_params, test_passed);
			deletePixelUnpackBuffer();

			deleteCubeMapArrayTexture();
		}
	}

	if (test_passed)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}